

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * TEST_bool_acc_or2(void)

{
  int iVar1;
  char *pcVar2;
  uint c;
  uint b;
  cargo_t cargo;
  uint a;
  char *args [2];
  
  iVar1 = cargo_init(&cargo,0,"program");
  if (iVar1 == 0) {
    a = 0;
    b = 0;
    c = 0;
    args[0]._0_4_ = 0x127be1;
    args[0]._4_4_ = 0;
    args[1]._0_4_ = 0x1273d2;
    args[1]._4_4_ = 0;
    iVar1 = cargo_add_option(cargo,0,"--alpha -a",(char *)0x0,"b|",&a,1,2);
    pcVar2 = "Failed to add option";
    if (((iVar1 == 0) &&
        (iVar1 = cargo_add_option(cargo,0,"--beta -b",(char *)0x0,"b|",&b,2,2,4), iVar1 == 0)) &&
       (iVar1 = cargo_add_option(cargo,0,"--centauri -c",(char *)0x0,"b|",&c,4,2,4,0x20,4),
       iVar1 == 0)) {
      iVar1 = cargo_parse(cargo,0,1,2,args);
      if (iVar1 == 0) {
        printf("a = Expect: 0x%x Got: 0x%x\n",2,(ulong)a);
        if ((a & 2) == 0) {
          pcVar2 = "Expected bit 1 to be set";
        }
        else if ((a & 0xfffffffd) == 0) {
          printf("b = Expect: 0x%x Got: 0x%x\n",6,(ulong)b);
          if ((~b & 6) == 0) {
            if ((b & 0xfffffff9) == 0) {
              printf("c = Expect: 0x%x Got: 0x%x\n",0x26,(ulong)c);
              if ((~c & 0x26) == 0) {
                pcVar2 = (char *)0x0;
                if ((c & 0xffffffd9) != 0) {
                  pcVar2 = "Expected no other bit than 1, 2 and 5 to be set";
                }
              }
              else {
                pcVar2 = "Expected bit 1, 2 and 5 to be set";
              }
            }
            else {
              pcVar2 = "Expected no other bit than 1 and 2 to be set";
            }
          }
          else {
            pcVar2 = "Expected bit 1 and 2 to be set";
          }
        }
        else {
          pcVar2 = "Expected no other bit than 1 to be set";
        }
      }
      else {
        pcVar2 = "Parse failed";
      }
    }
    cargo_destroy(&cargo);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_bool_acc_or2)
{
    unsigned int a = 0;
    unsigned int b = 0;
    unsigned int c = 0;
    unsigned int expected_bits = 0;
    char *args[] = { "program", "-cbaccbcb"};

    ret = cargo_add_option(cargo, 0, "--alpha -a", NULL,
            "b|", &a, 1, (1 << 1));
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_add_option(cargo, 0, "--beta -b", NULL,
            "b|", &b, 2, (1 << 1), (1 << 2));
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_add_option(cargo, 0, "--centauri -c", NULL,
            "b|", &c, 4, (1 << 1), (1 << 2), (1 << 5), (1 << 2));
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Parse failed");

    expected_bits = (1 << 1);
    printf("a = Expect: 0x%x Got: 0x%x\n", expected_bits, a);
    cargo_assert((a & expected_bits) == expected_bits, "Expected bit 1 to be set");
    cargo_assert((a ^ expected_bits) == 0, "Expected no other bit than 1 to be set");

    // We have 3 occurrances of "-b" but only 2 bits should still be set.
    expected_bits = (1 << 1) | (1 << 2);
    printf("b = Expect: 0x%x Got: 0x%x\n", expected_bits, b);
    cargo_assert((b & (expected_bits)) == expected_bits, "Expected bit 1 and 2 to be set");
    cargo_assert((b ^ (expected_bits)) == 0, "Expected no other bit than 1 and 2 to be set");

    expected_bits = (1 << 1) | (1 << 2) | (1 << 5);
    printf("c = Expect: 0x%x Got: 0x%x\n", expected_bits, c);
    cargo_assert((c & expected_bits) == expected_bits, "Expected bit 1, 2 and 5 to be set");
    cargo_assert((c ^ expected_bits) == 0, "Expected no other bit than 1, 2 and 5 to be set");

    _TEST_CLEANUP();
}